

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-delayed-accept.c
# Opt level: O2

void client_connect(void)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  undefined8 uVar4;
  char *pcVar5;
  sockaddr_in addr;
  
  pvVar2 = malloc(0xf8);
  pvVar3 = malloc(0x60);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    if (pvVar2 == (void *)0x0) {
      pcVar5 = "client != NULL";
      uVar4 = 0x9f;
    }
    else if (pvVar3 == (void *)0x0) {
      pcVar5 = "connect_req != NULL";
      uVar4 = 0xa0;
    }
    else {
      uVar4 = uv_default_loop();
      iVar1 = uv_tcp_init(uVar4,pvVar2);
      if (iVar1 == 0) {
        iVar1 = uv_tcp_connect(pvVar3,pvVar2,&addr,connect_cb);
        if (iVar1 == 0) {
          return;
        }
        pcVar5 = "r == 0";
        uVar4 = 0xa9;
      }
      else {
        pcVar5 = "r == 0";
        uVar4 = 0xa3;
      }
    }
  }
  else {
    pcVar5 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uVar4 = 0x9e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-delayed-accept.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

static void client_connect(void) {
  struct sockaddr_in addr;
  uv_tcp_t* client = (uv_tcp_t*)malloc(sizeof *client);
  uv_connect_t* connect_req = malloc(sizeof *connect_req);
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(client != NULL);
  ASSERT(connect_req != NULL);

  r = uv_tcp_init(uv_default_loop(), client);
  ASSERT(r == 0);

  r = uv_tcp_connect(connect_req,
                     client,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT(r == 0);
}